

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O0

void __thiscall
Js::DataView::SetValue<short,short*>
          (DataView *this,Var offset,short value,BOOL isLittleEndian,char16 *funcName)

{
  bool bVar1;
  uint32 uVar2;
  ScriptContext *scriptContext_00;
  ArrayBufferBase *this_00;
  uchar **ppuVar3;
  short *typedBuffer;
  uint32 byteOffset;
  uint32 length;
  ScriptContext *scriptContext;
  char16 *funcName_local;
  BOOL isLittleEndian_local;
  short value_local;
  Var offset_local;
  DataView *this_local;
  
  funcName_local._0_4_ = isLittleEndian;
  funcName_local._6_2_ = value;
  _isLittleEndian_local = offset;
  offset_local = this;
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  uVar2 = ArrayObject::GetLength((ArrayObject *)this);
  if (uVar2 < 2) {
    JavascriptError::ThrowRangeError(scriptContext_00,-0x7ff5ec1f,funcName);
  }
  uVar2 = ArrayBuffer::ToIndex(_isLittleEndian_local,-0x7ff5ec1f,scriptContext_00,uVar2 - 2,false);
  this_00 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  bVar1 = ArrayBufferBase::IsDetached(this_00);
  if (!bVar1) {
    ppuVar3 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->buffer);
    if ((BOOL)funcName_local == 0) {
      SwapRoutine<short>(this,(int16 *)((long)&funcName_local + 6),(int16 *)(*ppuVar3 + uVar2));
    }
    else {
      *(short *)(*ppuVar3 + uVar2) = funcName_local._6_2_;
    }
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ebe5,funcName);
}

Assistant:

void SetValue(Var offset, TypeName value, BOOL isLittleEndian, const char16 *funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(&value, typedBuffer);
            }
            else
            {
                *static_cast<PointerAccessTypeName>(typedBuffer) = value;
            }
        }